

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1130ba::RedefsMIPTest_PureMILP__01__seemsPassedToBackendCorrectly_Test::TestBody
          (RedefsMIPTest_PureMILP__01__seemsPassedToBackendCorrectly_Test *this)

{
  initializer_list<const_char_*> nms;
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  MIPConverterTester tester;
  Env e;
  MIPInstance milp;
  Env *e_00;
  BasicSolver *this_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffff7590;
  vector<double,_std::allocator<double>_> *this_01;
  undefined4 in_stack_ffffffffffff7598;
  int in_stack_ffffffffffff759c;
  undefined4 in_stack_ffffffffffff75a0;
  undefined1 in_stack_ffffffffffff75a4;
  undefined1 in_stack_ffffffffffff75a5;
  undefined1 in_stack_ffffffffffff75a6;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffff75a7;
  undefined4 in_stack_ffffffffffff75a8;
  Type in_stack_ffffffffffff75ac;
  BasicSolver *in_stack_ffffffffffff75b0;
  initializer_list<mip_converter_test::MIPInstance::Constraint> in_stack_ffffffffffff75b8;
  char *in_stack_ffffffffffff75e0;
  char *in_stack_ffffffffffff75e8;
  char *in_stack_ffffffffffff75f0;
  undefined6 in_stack_ffffffffffff75f8;
  undefined1 uVar7;
  AssertHelper *local_89f0;
  MIPInstance *interface;
  MIPInstance *local_89d8;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *this_02;
  string local_8978 [56];
  VarArrayDef *in_stack_ffffffffffff76c0;
  initializer_list<double> in_stack_ffffffffffff76c8;
  initializer_list<double> in_stack_ffffffffffff76d8;
  initializer_list<mp::var::Type> in_stack_ffffffffffff76f0;
  undefined1 in_stack_ffffffffffff7700 [12];
  undefined4 in_stack_ffffffffffff770c;
  uint uVar8;
  string local_88f0 [48];
  AssertionResult local_88c0 [2137];
  undefined1 local_329;
  undefined1 local_328;
  undefined1 local_326;
  undefined4 local_324;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 *local_318;
  undefined8 local_310;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 *local_2c8;
  undefined8 local_2c0;
  undefined1 *local_2a0;
  undefined1 local_298 [72];
  pointer local_250;
  initializer_list<const_char_*> local_248;
  undefined1 local_234 [20];
  BasicSolver *pBStack_220;
  pointer local_218;
  size_t sStack_210;
  pointer local_208;
  pointer *local_1f8;
  undefined8 local_1f0;
  pointer local_1e8;
  pointer pCStack_1e0;
  pointer local_1d8;
  pointer *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b6;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined1 local_1ac [12];
  undefined8 local_1a0;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 local_128;
  AssertHelper local_120 [7];
  AssertHelper local_e8;
  undefined8 local_e0;
  
  local_1b6 = 1;
  local_128 = local_120;
  local_120[0].data_._0_4_ = 0;
  local_158 = 0x4004000000000000;
  local_168 = 0x3ff0000000000000;
  uStack_160 = 0x3ff0000000000000;
  local_150 = &local_168;
  local_148 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x133164);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffff75b0,
             (initializer_list<double>)in_stack_ffffffffffff75b8,
             (allocator_type *)CONCAT44(in_stack_ffffffffffff75ac,in_stack_ffffffffffff75a8));
  local_1b4 = 0;
  local_1b0 = 1;
  local_1ac._0_4_ = 2;
  local_1ac._4_8_ = &local_1b4;
  local_1a0 = 3;
  std::allocator<int>::allocator((allocator<int> *)0x1331dd);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffff75b0,
             (initializer_list<int>)in_stack_ffffffffffff75b8,
             (allocator_type *)CONCAT44(in_stack_ffffffffffff75ac,in_stack_ffffffffffff75a8));
  mip_converter_test::MIPInstance::SparseVec::SparseVec
            ((SparseVec *)
             CONCAT17(in_stack_ffffffffffff75a7,
                      CONCAT16(in_stack_ffffffffffff75a6,
                               CONCAT15(in_stack_ffffffffffff75a5,
                                        CONCAT14(in_stack_ffffffffffff75a4,in_stack_ffffffffffff75a0
                                                )))),
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffff759c,in_stack_ffffffffffff7598),in_stack_ffffffffffff7590
            );
  local_1b6 = 0;
  local_e8.data_ = (AssertHelperData *)local_120;
  local_e0 = 1;
  std::allocator<mip_converter_test::MIPInstance::Objective>::allocator
            ((allocator<mip_converter_test::MIPInstance::Objective> *)0x13325c);
  std::
  vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
  ::vector((vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
            *)in_stack_ffffffffffff75b0,
           (initializer_list<mip_converter_test::MIPInstance::Objective>)in_stack_ffffffffffff75b8,
           (allocator_type *)CONCAT44(in_stack_ffffffffffff75ac,in_stack_ffffffffffff75a8));
  local_329 = 1;
  local_1d8 = (pointer)0xbff3333333333333;
  local_1e8 = (pointer)0x0;
  pCStack_1e0 = (pointer)0x0;
  local_1c8 = &local_1e8;
  local_1c0 = 3;
  local_208 = (pointer)0x4014cccccccccccd;
  local_218 = (pointer)0x3ff0000000000000;
  sStack_210 = 0x4008000000000000;
  local_1f8 = &local_218;
  local_1f0 = 3;
  local_234._0_4_ = 1;
  local_234._4_4_ = 0;
  local_234._8_4_ = 0;
  local_234._12_8_ = local_234;
  pBStack_220 = (BasicSolver *)0x3;
  std::initializer_list<const_char_*>::initializer_list(&local_248);
  nms._M_len._4_4_ = in_stack_ffffffffffff770c;
  nms._0_12_ = in_stack_ffffffffffff7700;
  e_00 = (Env *)local_234._12_8_;
  this_00 = pBStack_220;
  mp::VarArrayDef::VarArrayDef
            (in_stack_ffffffffffff76c0,in_stack_ffffffffffff76d8,in_stack_ffffffffffff76c8,
             in_stack_ffffffffffff76f0,nms);
  local_328 = 1;
  this_02 = (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *)&stack0xffffffffffffffe0;
  local_326 = 1;
  local_2a0 = local_298;
  local_2d8 = 0x4010000000000000;
  local_2e8 = 0x4000000000000000;
  uStack_2e0 = 0;
  local_2c8 = &local_2e8;
  local_2c0 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x133432);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffff75b0,
             (initializer_list<double>)in_stack_ffffffffffff75b8,
             (allocator_type *)CONCAT44(in_stack_ffffffffffff75ac,in_stack_ffffffffffff75a8));
  local_324 = 0;
  local_320 = 1;
  local_31c = 2;
  local_318 = &local_324;
  local_310 = 3;
  std::allocator<int>::allocator((allocator<int> *)0x1334ab);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffff75b0,
             (initializer_list<int>)in_stack_ffffffffffff75b8,
             (allocator_type *)CONCAT44(in_stack_ffffffffffff75ac,in_stack_ffffffffffff75a8));
  mip_converter_test::MIPInstance::SparseVec::SparseVec
            ((SparseVec *)
             CONCAT17(in_stack_ffffffffffff75a7,
                      CONCAT16(in_stack_ffffffffffff75a6,
                               CONCAT15(in_stack_ffffffffffff75a5,
                                        CONCAT14(in_stack_ffffffffffff75a4,in_stack_ffffffffffff75a0
                                                )))),
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffff759c,in_stack_ffffffffffff7598),
             (vector<int,_std::allocator<int>_> *)local_248._M_len);
  local_298._48_8_ = (double *)0xd4b249ad2594c37d;
  local_298._56_8_ = 0x404c333333333333;
  local_326 = 0;
  local_298._64_8_ = local_298;
  local_250 = (pointer)0x1;
  std::allocator<mip_converter_test::MIPInstance::Constraint>::allocator
            ((allocator<mip_converter_test::MIPInstance::Constraint> *)0x13354e);
  std::
  vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
  ::vector((vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
            *)in_stack_ffffffffffff75b0,in_stack_ffffffffffff75b8,
           (allocator_type *)CONCAT44(in_stack_ffffffffffff75ac,in_stack_ffffffffffff75a8));
  local_328 = 0;
  local_329 = 0;
  std::allocator<mip_converter_test::MIPInstance::Constraint>::~allocator
            ((allocator<mip_converter_test::MIPInstance::Constraint> *)0x133592);
  interface = (MIPInstance *)local_298;
  local_89d8 = (MIPInstance *)(local_298 + 0x40);
  this_01 = (vector<double,_std::allocator<double>_> *)local_248._M_len;
  do {
    local_89d8 = (MIPInstance *)&local_89d8[-1].vars_.names_;
    mip_converter_test::MIPInstance::Constraint::~Constraint((Constraint *)0x1335c7);
  } while (local_89d8 != interface);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  std::allocator<int>::~allocator((allocator<int> *)0x1335fe);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::allocator<double>::~allocator((allocator<double> *)0x133618);
  std::allocator<mip_converter_test::MIPInstance::Objective>::~allocator
            ((allocator<mip_converter_test::MIPInstance::Objective> *)0x133625);
  local_89f0 = &local_e8;
  do {
    local_89f0 = local_89f0 + -7;
    mip_converter_test::MIPInstance::Objective::~Objective((Objective *)0x13365a);
  } while (local_89f0 != local_120);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  std::allocator<int>::~allocator((allocator<int> *)0x133691);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  std::allocator<double>::~allocator((allocator<double> *)0x1336ab);
  mp::BasicSolver::BasicSolver(in_stack_ffffffffffff75b0);
  mip_converter_test::MIPConverterTester::MIPConverterTester((MIPConverterTester *)this_00,e_00);
  mip_converter_test::feedInstance<mip_converter_test::MIPConverterTester>
            ((MIPConverterTester *)interface,local_89d8);
  mp::
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ConvertModel(this_02);
  uVar1 = mip_converter_test::MIPConverterTester::ObjsEqual
                    ((MIPConverterTester *)this_00,(MIPInstance *)e_00);
  testing::AssertionResult::AssertionResult((AssertionResult *)this_00,SUB81((ulong)e_00 >> 0x38,0))
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_88c0);
  uVar7 = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffff75b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar1,CONCAT16(uVar7,in_stack_ffffffffffff75f8)),
               in_stack_ffffffffffff75f0,in_stack_ffffffffffff75e8,in_stack_ffffffffffff75e0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffff75b0,in_stack_ffffffffffff75ac,
               (char *)CONCAT17(in_stack_ffffffffffff75a7,
                                CONCAT16(in_stack_ffffffffffff75a6,
                                         CONCAT15(in_stack_ffffffffffff75a5,
                                                  CONCAT14(in_stack_ffffffffffff75a4,
                                                           in_stack_ffffffffffff75a0)))),
               in_stack_ffffffffffff759c,(char *)this_01);
    testing::internal::AssertHelper::operator=
              (local_89f0,(Message *)CONCAT17(uVar1,CONCAT16(uVar7,in_stack_ffffffffffff75f8)));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_88f0);
    testing::Message::~Message((Message *)0x133b21);
  }
  uVar8 = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x133baf);
  if (uVar8 == 0) {
    uVar3 = mip_converter_test::MIPConverterTester::VarBoundsEqual
                      ((MIPConverterTester *)this_00,(MIPInstance *)e_00);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)this_00,SUB81((ulong)e_00 >> 0x38,0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffff76f8);
    uVar6 = bVar2;
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_ffffffffffff75b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar1,CONCAT16(uVar7,in_stack_ffffffffffff75f8)),
                 in_stack_ffffffffffff75f0,in_stack_ffffffffffff75e8,in_stack_ffffffffffff75e0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffff75b0,in_stack_ffffffffffff75ac,
                 (char *)CONCAT17(uVar3,CONCAT16(uVar6,CONCAT15(in_stack_ffffffffffff75a5,
                                                                CONCAT14(in_stack_ffffffffffff75a4,
                                                                         in_stack_ffffffffffff75a0))
                                                )),in_stack_ffffffffffff759c,(char *)this_01);
      testing::internal::AssertHelper::operator=
                (local_89f0,(Message *)CONCAT17(uVar1,CONCAT16(uVar7,in_stack_ffffffffffff75f8)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      std::__cxx11::string::~string((string *)&stack0xffffffffffff76c8);
      testing::Message::~Message((Message *)0x133cea);
    }
    uVar8 = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x133d78);
    if (uVar8 == 0) {
      uVar4 = mip_converter_test::MIPConverterTester::NConstrEqual
                        ((MIPConverterTester *)this_00,(MIPInstance *)e_00);
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)this_00,SUB81((ulong)e_00 >> 0x38,0));
      uVar5 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)(local_8978 + 0x30));
      if (!(bool)uVar5) {
        testing::Message::Message((Message *)in_stack_ffffffffffff75b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)CONCAT17(uVar1,CONCAT16(uVar7,in_stack_ffffffffffff75f8)),
                   in_stack_ffffffffffff75f0,in_stack_ffffffffffff75e8,in_stack_ffffffffffff75e0);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_ffffffffffff75b0,in_stack_ffffffffffff75ac,
                   (char *)CONCAT17(uVar3,CONCAT16(uVar6,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_ffffffffffff75a0)))),
                   in_stack_ffffffffffff759c,(char *)this_01);
        testing::internal::AssertHelper::operator=
                  (local_89f0,(Message *)CONCAT17(uVar1,CONCAT16(uVar7,in_stack_ffffffffffff75f8)));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
        std::__cxx11::string::~string(local_8978);
        testing::Message::~Message((Message *)0x133eb3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x133f41);
    }
  }
  mip_converter_test::MIPConverterTester::~MIPConverterTester((MIPConverterTester *)0x133f66);
  mp::BasicSolver::~BasicSolver(this_00);
  mip_converter_test::MIPInstance::~MIPInstance((MIPInstance *)this_00);
  return;
}

Assistant:

TEST(RedefsMIPTest, PureMILP__01__seemsPassedToBackendCorrectly) {
  MIPInstance milp {
    { { minimize_,
        { { 1, 1, 2.5 },
          { 0, 1, 2 } } } },
    { {  0.0,  0.0, -1.2 },
      {  1.0,  3.0,  5.2 },
      {  I_,   F_,   F_ } },
    {
      { { { 2, 0.0, 4 },
          { 0, 1,   2 } }, -infty_, 56.4 }
    }
  };
  mp::Env e;
  MIPConverterTester tester(e);
  feedInstance(tester, milp);
  tester.ConvertModel();
  ASSERT_TRUE(tester.ObjsEqual(milp));
  ASSERT_TRUE(tester.VarBoundsEqual(milp));
  ASSERT_TRUE(tester.NConstrEqual(milp));
}